

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

void bs_predict_vote(example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  pointer pdVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  int local_4c;
  
  pdVar1 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  uVar10 = lVar5 >> 3;
  bVar2 = false;
  piVar6 = (int *)operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | lVar5 >> 1);
  iVar8 = 1;
  local_4c = 1;
  iVar11 = 0;
  for (uVar12 = 0; uVar13 = (ulong)uVar12, uVar13 < uVar10; uVar12 = uVar12 + 1) {
    dVar15 = floor(pdVar1[uVar13] + 0.5);
    iVar4 = (int)dVar15;
    piVar6[uVar13] = iVar4;
    iVar7 = iVar8;
    iVar3 = local_4c;
    bVar14 = bVar2;
    if ((!bVar2) && (iVar7 = iVar4, iVar3 = iVar4, uVar13 != 0)) {
      if (local_4c != iVar4) {
        bVar14 = true;
      }
      if (iVar8 == iVar4) {
        bVar14 = bVar2;
      }
      iVar7 = iVar8;
      iVar3 = local_4c;
      if (local_4c == iVar8) {
        bVar14 = bVar2;
      }
    }
    bVar2 = bVar14;
    local_4c = iVar3;
    iVar8 = iVar4;
    if (iVar11 == 0) {
      iVar11 = 1;
    }
    else if (iVar7 == iVar4) {
      iVar11 = iVar11 + 1;
    }
    else {
      iVar11 = iVar11 + -1;
      iVar8 = iVar7;
    }
  }
  if (iVar11 == 0) {
    bVar14 = false;
  }
  else {
    if (!bVar2) goto LAB_001a18c2;
    iVar11 = 0;
    for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 1) {
      iVar11 = iVar11 + (uint)(piVar6[uVar12] == iVar8);
    }
    bVar14 = uVar10 < (uint)(iVar11 * 2);
    bVar2 = true;
  }
  if ((!bVar14) && (bVar2)) {
    std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(piVar6,piVar6 + uVar10);
    iVar11 = *piVar6;
    uVar12 = 1;
    uVar9 = 1;
    for (uVar10 = 1;
        uVar10 < (ulong)((long)(pred_vec->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pred_vec->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3);
        uVar10 = (ulong)((int)uVar10 + 1)) {
      if (iVar11 == piVar6[uVar10]) {
        uVar9 = uVar9 + 1;
      }
      else {
        if (uVar12 < uVar9) {
          iVar8 = iVar11;
          uVar12 = uVar9;
        }
        uVar9 = 1;
        iVar11 = piVar6[uVar10];
      }
    }
  }
LAB_001a18c2:
  operator_delete__(piVar6);
  (ec->pred).scalar = (float)iVar8;
  ec->loss = (float)(~-(uint)((float)iVar8 == (ec->l).simple.label) & 0x3f800000) * ec->weight;
  return;
}

Assistant:

void bs_predict_vote(example& ec, vector<double>& pred_vec)
{
  // majority vote in linear time
  unsigned int counter = 0;
  int current_label = 1, init_label = 1;
  // float sum_labels = 0; // uncomment for: "avg on votes" and getLoss()
  bool majority_found = false;
  bool multivote_detected = false;  // distinct(votes)>2: used to skip part of the algorithm
  auto pred_vec_sz = pred_vec.size();
  int* pred_vec_int = new int[pred_vec_sz];

  for (unsigned int i = 0; i < pred_vec_sz; i++)
  {
    pred_vec_int[i] = (int)floor(
        pred_vec[i] + 0.5);  // could be added: link(), min_label/max_label, cutoff between true/false for binary

    if (multivote_detected == false)  // distinct(votes)>2 detection bloc
    {
      if (i == 0)
      {
        init_label = pred_vec_int[i];
        current_label = pred_vec_int[i];
      }
      else if (init_label != current_label && pred_vec_int[i] != current_label && pred_vec_int[i] != init_label)
        multivote_detected = true;  // more than 2 distinct votes detected
    }

    if (counter == 0)
    {
      counter = 1;
      current_label = pred_vec_int[i];
    }
    else
    {
      if (pred_vec_int[i] == current_label)
        counter++;
      else
      {
        counter--;
      }
    }
  }

  if (counter > 0 && multivote_detected)  // remove this condition for: "avg on votes" and getLoss()
  {
    counter = 0;
    for (unsigned int i = 0; i < pred_vec.size(); i++)
      if (pred_vec_int[i] == current_label)
      {
        counter++;
        // sum_labels += pred_vec[i]; // uncomment for: "avg on votes" and getLoss()
      }
    if (counter * 2 > pred_vec.size())
      majority_found = true;
  }

  if (multivote_detected && majority_found == false)  // then find most frequent element - if tie: smallest tie label
  {
    std::sort(pred_vec_int, pred_vec_int + pred_vec.size());
    int tmp_label = pred_vec_int[0];
    counter = 1;
    for (unsigned int i = 1, temp_count = 1; i < pred_vec.size(); i++)
    {
      if (tmp_label == pred_vec_int[i])
        temp_count++;
      else
      {
        if (temp_count > counter)
        {
          current_label = tmp_label;
          counter = temp_count;
        }
        tmp_label = pred_vec_int[i];
        temp_count = 1;
      }
    }
    /* uncomment for: "avg on votes" and getLoss()
    sum_labels = 0;
    for(unsigned int i=0; i<pred_vec.size(); i++)
      if(pred_vec_int[i] == current_label)
        sum_labels += pred_vec[i]; */
  }
  // TODO: unique_ptr would also handle exception case
  delete[] pred_vec_int;

  // ld.prediction = sum_labels/(float)counter; //replace line below for: "avg on votes" and getLoss()
  ec.pred.scalar = (float)current_label;

  // ec.loss = all.loss->getLoss(all.sd, ld.prediction, ld.label) * ec.weight; //replace line below for: "avg on votes"
  // and getLoss()
  ec.loss = ((ec.pred.scalar == ec.l.simple.label) ? 0.f : 1.f) * ec.weight;
}